

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

void __thiscall QAccessibleWidget::doAction(QAccessibleWidget *this)

{
  QString *in_stack_00000018;
  QAccessibleWidget *in_stack_00000020;
  
  doAction(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void QAccessibleWidget::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == setFocusAction()) {
        if (widget()->isWindow())
            widget()->activateWindow();
        widget()->setFocus();
    }
}